

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

pair<double_*,_bool>
HighsHashTree<std::pair<int,_int>,_double>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,
          HighsHashTableEntry<std::pair<int,_int>,_double> *entry)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  double dVar5;
  uint uVar6;
  InnerLeaf<1> *this;
  ValueType *pVVar7;
  ulong *puVar8;
  undefined8 *puVar9;
  sbyte sVar10;
  int iVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar12;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  ulong uVar13;
  undefined8 *puVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  double *pdVar21;
  array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *paVar22;
  Entry *pEVar23;
  int i;
  double *pdVar24;
  BranchNode *branch;
  InnerLeaf<4> *this_00;
  undefined1 auVar25 [16];
  pair<double_*,_bool> pVar26;
  pair<double_*,_bool> pVar27;
  array<unsigned_char,_55UL> sizes;
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [15];
  undefined1 uStack_39;
  undefined7 uStack_38;
  
  uVar13 = insertNode->ptrAndType;
  switch((uint)uVar13 & 7) {
  case 0:
    if (hashPos == 9) {
      puVar9 = (undefined8 *)operator_new(0x20);
      *puVar9 = 0;
      dVar5 = entry->value_;
      *(pair<int,_int> *)(puVar9 + 1) = entry->key_;
      puVar9[2] = dVar5;
      *(undefined4 *)(puVar9 + 3) = 1;
      insertNode->ptrAndType = (ulong)puVar9 | 1;
      pVar27._9_7_ = (int7)((ulong)extraout_RDX >> 8);
      pVar27.second = true;
      pVar27.first = (double *)(puVar9 + 2);
    }
    else {
      this = (InnerLeaf<1> *)operator_new(0xa8);
      (this->occupation).occupation = 0;
      this->size = 0;
      lVar20 = 0x4c;
      do {
        *(undefined8 *)((long)(this->hashes)._M_elems + lVar20 + -0x14) = 0;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0xac);
      (this->hashes)._M_elems[0] = 0;
      insertNode->ptrAndType = (ulong)this | 2;
      pVar27 = InnerLeaf<1>::insert_entry(this,hash,hashPos,entry);
    }
    break;
  case 1:
    puVar9 = (undefined8 *)(uVar13 & 0xfffffffffffffff8);
    do {
      puVar14 = puVar9;
      auVar25._0_4_ = -(uint)((int)puVar14[1] == (entry->key_).first);
      iVar16 = -(uint)((int)((ulong)puVar14[1] >> 0x20) == (entry->key_).second);
      auVar25._4_4_ = auVar25._0_4_;
      auVar25._8_4_ = iVar16;
      auVar25._12_4_ = iVar16;
      iVar16 = movmskpd((int)puVar14,auVar25);
      if (iVar16 == 3) {
        uVar12 = 0;
        goto LAB_0032d4f7;
      }
      puVar9 = (undefined8 *)*puVar14;
    } while ((undefined8 *)*puVar14 != (undefined8 *)0x0);
    puVar9 = (undefined8 *)operator_new(0x18);
    *puVar9 = 0;
    dVar5 = entry->value_;
    *(pair<int,_int> *)(puVar9 + 1) = entry->key_;
    puVar9[2] = dVar5;
    *puVar14 = puVar9;
    piVar1 = (int *)((undefined8 *)(uVar13 & 0xfffffffffffffff8) + 3);
    *piVar1 = *piVar1 + 1;
    uVar12 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
    puVar14 = puVar9;
LAB_0032d4f7:
    pVar27._8_8_ = uVar12;
    pVar27.first = (double *)(puVar14 + 2);
    break;
  case 2:
    pVar27 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar13 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar27 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar13 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar27 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar13 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar13 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar26 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      bVar2 = true;
    }
    else {
      pVVar7 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->key_);
      if (pVVar7 == (ValueType *)0x0) {
        uVar6 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
        uVar13 = (this_00->occupation).occupation | 1L << (ulong)uVar6;
        pdVar21 = (double *)POPCOUNT(uVar13);
        uVar3 = (uint)pdVar21;
        puVar8 = (ulong *)operator_new((ulong)(uVar3 * 8 + 0x47 & 0xffffffc0));
        *puVar8 = 0;
        insertNode->ptrAndType = (ulong)puVar8 | 6;
        *puVar8 = uVar13;
        iVar16 = hashPos + 1;
        sVar10 = (sbyte)uVar6;
        if (iVar16 == 9) {
          memset(puVar8 + 1,0,(ulong)((uVar3 + (pdVar21 == (double *)0x0)) * 8));
          if (0 < this_00->size) {
            paVar22 = &this_00->entries;
            lVar20 = 0;
            local_70 = uVar13;
            do {
              lVar15 = POPCOUNT(local_70 >>
                                ((byte)((uint)(this_00->hashes)._M_elems[lVar20] >> 10) & 0x3f));
              if ((puVar8[lVar15] & 7) == 0) {
                puVar9 = (undefined8 *)operator_new(0x20);
                *puVar9 = 0;
                dVar5 = paVar22->_M_elems[0].value_;
                *(pair<int,_int> *)(puVar9 + 1) = paVar22->_M_elems[0].key_;
                puVar9[2] = dVar5;
                *(undefined4 *)(puVar9 + 3) = 1;
                puVar8[lVar15] = (ulong)puVar9 | 1;
              }
              else {
                puVar14 = (undefined8 *)(puVar8[lVar15] & 0xfffffffffffffff8);
                puVar9 = (undefined8 *)operator_new(0x18);
                puVar9[2] = puVar14[2];
                uVar12 = puVar14[1];
                *puVar9 = *puVar14;
                puVar9[1] = uVar12;
                *puVar14 = puVar9;
                *(int *)(puVar14 + 1) = paVar22->_M_elems[0].key_.first;
                *(int *)((long)puVar14 + 0xc) = paVar22->_M_elems[0].key_.second;
                puVar14[2] = paVar22->_M_elems[0].value_;
                *(int *)(puVar14 + 3) = *(int *)(puVar14 + 3) + 1;
              }
              lVar20 = lVar20 + 1;
              paVar22 = (array<HighsHashTableEntry<std::pair<int,_int>,_double>,_54UL> *)
                        (paVar22->_M_elems + 1);
              uVar13 = local_70;
            } while (lVar20 < this_00->size);
          }
          operator_delete(this_00);
          if ((puVar8[POPCOUNT(uVar13 >> sVar10)] & 7) == 0) {
            puVar9 = (undefined8 *)operator_new(0x20);
            *puVar9 = 0;
            dVar5 = entry->value_;
            *(pair<int,_int> *)(puVar9 + 1) = entry->key_;
            puVar9[2] = dVar5;
            *(undefined4 *)(puVar9 + 3) = 1;
            puVar8[POPCOUNT(uVar13 >> sVar10)] = (ulong)puVar9 | 1;
            uVar12 = extraout_RDX_03;
          }
          else {
            puVar9 = (undefined8 *)(puVar8[POPCOUNT(uVar13 >> sVar10)] & 0xfffffffffffffff8);
            puVar14 = (undefined8 *)operator_new(0x18);
            puVar14[2] = puVar9[2];
            uVar12 = puVar9[1];
            *puVar14 = *puVar9;
            puVar14[1] = uVar12;
            *puVar9 = puVar14;
            *(int *)(puVar9 + 1) = (entry->key_).first;
            *(int *)((long)puVar9 + 0xc) = (entry->key_).second;
            puVar9[2] = entry->value_;
            *(int *)(puVar9 + 3) = *(int *)(puVar9 + 3) + 1;
            uVar12 = extraout_RDX_01;
          }
          bVar2 = true;
          pVar26._9_7_ = (int7)((ulong)uVar12 >> 8);
          pVar26.second = true;
          pVar26.first = (double *)(puVar9 + 2);
        }
        else if (uVar3 < 2) {
          insertNode = (NodePtr *)(puVar8 + 1);
          puVar8[1] = (ulong)this_00 | 5;
          InnerLeaf<4>::rehash(this_00,iVar16);
          pVar26._8_8_ = extraout_RDX_02;
          pVar26.first = pdVar21;
          bVar2 = false;
          hashPos = iVar16;
        }
        else {
          uVar6 = this_00->size;
          iVar11 = (uVar6 - uVar3) + 2;
          bVar2 = iVar11 < 7;
          if (SBORROW4(iVar11,7) == (int)((uVar6 - uVar3) + -5) < 0) {
            local_48 = SUB1615((undefined1  [16])0x0,0);
            local_58 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            uStack_39 = 0;
            uStack_38 = 0;
            local_68[POPCOUNT(uVar13 >> sVar10) + -1] =
                 local_68[POPCOUNT(uVar13 >> sVar10) + -1] + '\x01';
            if (0 < (int)uVar6) {
              uVar17 = 0;
              do {
                local_68[POPCOUNT(uVar13 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar17] >> 10)
                                            & 0x3f)) + -1] =
                     local_68[POPCOUNT(uVar13 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar17] >>
                                                        10) & 0x3f)) + -1] + '\x01';
                uVar17 = uVar17 + 1;
              } while (uVar6 != uVar17);
            }
            pEVar23 = (Entry *)0x0;
            do {
              switch((byte)local_68[(long)pEVar23] + 9 >> 4) {
              case 0:
                puVar9 = (undefined8 *)operator_new(0xa8);
                *puVar9 = 0;
                *(undefined4 *)(puVar9 + 1) = 0;
                lVar20 = 0x4c;
                do {
                  *(undefined8 *)((long)puVar9 + lVar20 + -4) = 0;
                  lVar20 = lVar20 + 0x10;
                } while (lVar20 != 0xac);
                uVar17 = 2;
                break;
              case 1:
                puVar9 = (undefined8 *)operator_new(0x228);
                *puVar9 = 0;
                *(undefined4 *)(puVar9 + 1) = 0;
                lVar20 = 0xcc;
                do {
                  *(undefined8 *)((long)puVar9 + lVar20 + -4) = 0;
                  lVar20 = lVar20 + 0x10;
                } while (lVar20 != 0x22c);
                uVar17 = 3;
                break;
              case 2:
                puVar9 = (undefined8 *)operator_new(0x3a8);
                *puVar9 = 0;
                *(undefined4 *)(puVar9 + 1) = 0;
                lVar20 = 0x14c;
                do {
                  *(undefined8 *)((long)puVar9 + lVar20 + -4) = 0;
                  lVar20 = lVar20 + 0x10;
                } while (lVar20 != 0x3ac);
                uVar17 = 4;
                break;
              case 3:
                puVar9 = (undefined8 *)operator_new(0x528);
                *puVar9 = 0;
                *(undefined4 *)(puVar9 + 1) = 0;
                lVar20 = 0x1cc;
                do {
                  *(undefined8 *)((long)puVar9 + lVar20 + -4) = 0;
                  lVar20 = lVar20 + 0x10;
                } while (lVar20 != 0x52c);
                uVar17 = 5;
                break;
              default:
                goto switchD_0032d9ed_default;
              }
              puVar9[2] = 0;
              puVar8[(long)((long)&(pEVar23->key_).first + 1)] = uVar17 | (ulong)puVar9;
switchD_0032d9ed_default:
              pEVar23 = (Entry *)((long)&(pEVar23->key_).first + 1);
            } while (pEVar23 != (Entry *)(ulong)(uVar3 + (uVar3 == 0)));
            if (0 < this_00->size) {
              pEVar23 = (this_00->entries)._M_elems;
              lVar20 = 0;
              do {
                uVar17 = puVar8[POPCOUNT(uVar13 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar20]
                                                          >> 10) & 0x3f))];
                switch((uint)uVar17 & 7) {
                case 2:
                  uVar18 = (ulong)pEVar23->key_ & 0xffffffff;
                  uVar19 = (ulong)pEVar23->key_ >> 0x20;
                  InnerLeaf<1>::insert_entry
                            ((InnerLeaf<1> *)(uVar17 & 0xfffffffffffffff8),
                             (uVar19 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20 ^
                             (uVar19 + 0x8a183895eeac1536) * (uVar18 + 0x42d8680e260ae5b),iVar16,
                             pEVar23);
                  break;
                case 3:
                  uVar18 = (ulong)pEVar23->key_ & 0xffffffff;
                  uVar19 = (ulong)pEVar23->key_ >> 0x20;
                  InnerLeaf<2>::insert_entry
                            ((InnerLeaf<2> *)(uVar17 & 0xfffffffffffffff8),
                             (uVar19 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20 ^
                             (uVar19 + 0x8a183895eeac1536) * (uVar18 + 0x42d8680e260ae5b),iVar16,
                             pEVar23);
                  break;
                case 4:
                  uVar18 = (ulong)pEVar23->key_ & 0xffffffff;
                  uVar19 = (ulong)pEVar23->key_ >> 0x20;
                  InnerLeaf<3>::insert_entry
                            ((InnerLeaf<3> *)(uVar17 & 0xfffffffffffffff8),
                             (uVar19 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20 ^
                             (uVar19 + 0x8a183895eeac1536) * (uVar18 + 0x42d8680e260ae5b),iVar16,
                             pEVar23);
                  break;
                case 5:
                  uVar18 = (ulong)pEVar23->key_ & 0xffffffff;
                  uVar19 = (ulong)pEVar23->key_ >> 0x20;
                  InnerLeaf<4>::insert_entry
                            ((InnerLeaf<4> *)(uVar17 & 0xfffffffffffffff8),
                             (uVar19 + 0x80c8963be3e4c2f3) * (uVar18 + 0xc8497d2a400d9551) >> 0x20 ^
                             (uVar19 + 0x8a183895eeac1536) * (uVar18 + 0x42d8680e260ae5b),iVar16,
                             pEVar23);
                }
                lVar20 = lVar20 + 1;
                pEVar23 = pEVar23 + 1;
              } while (lVar20 < this_00->size);
            }
            operator_delete(this_00);
            pVar26._8_8_ = extraout_RDX_04;
            pVar26.first = (double *)pEVar23;
            insertNode = (NodePtr *)(puVar8 + POPCOUNT(uVar13 >> sVar10));
            hashPos = iVar16;
          }
          else {
            pdVar24 = (double *)0x0;
            do {
              puVar9 = (undefined8 *)operator_new(0xa8);
              *puVar9 = 0;
              *(undefined4 *)(puVar9 + 1) = 0;
              lVar20 = 0;
              do {
                *(undefined8 *)((long)puVar9 + lVar20 + 0x48) = 0;
                lVar20 = lVar20 + 0x10;
              } while (lVar20 != 0x60);
              puVar9[2] = 0;
              puVar8[(long)pdVar24 + 1] = (ulong)puVar9 | 2;
              pdVar24 = (double *)((long)pdVar24 + 1);
            } while (pdVar24 != pdVar21);
            if (0 < this_00->size) {
              pEVar23 = (this_00->entries)._M_elems;
              lVar20 = 0;
              do {
                uVar17 = (ulong)pEVar23->key_ & 0xffffffff;
                uVar18 = (ulong)pEVar23->key_ >> 0x20;
                InnerLeaf<1>::insert_entry
                          ((InnerLeaf<1> *)
                           (puVar8[POPCOUNT(uVar13 >> ((byte)((uint)(this_00->hashes)._M_elems
                                                                    [lVar20] >> 10) & 0x3f))] &
                           0xfffffffffffffff8),
                           (uVar18 + 0x80c8963be3e4c2f3) * (uVar17 + 0xc8497d2a400d9551) >> 0x20 ^
                           (uVar18 + 0x8a183895eeac1536) * (uVar17 + 0x42d8680e260ae5b),iVar16,
                           pEVar23);
                lVar20 = lVar20 + 1;
                pEVar23 = pEVar23 + 1;
              } while (lVar20 < this_00->size);
            }
            operator_delete(this_00);
            pVar26 = InnerLeaf<1>::insert_entry
                               ((InnerLeaf<1> *)
                                (puVar8[POPCOUNT(uVar13 >> sVar10)] & 0xfffffffffffffff8),hash,
                                iVar16,entry);
          }
        }
      }
      else {
        bVar2 = true;
        pVar26._8_8_ = 0;
        pVar26.first = pVVar7;
      }
    }
    if (bVar2) {
      return pVar26;
    }
  case 7:
switchD_0032d395_caseD_7:
    pVar27 = insert_recurse(insertNode,hash,hashPos,entry);
    break;
  case 6:
    uVar17 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    branch = (BranchNode *)(uVar13 & 0xfffffffffffffff8);
    uVar13 = (branch->occupation).occupation;
    bVar4 = (byte)uVar17;
    lVar20 = POPCOUNT(uVar13 >> (bVar4 & 0x3f));
    if ((uVar13 >> (uVar17 & 0x3f) & 1) == 0) {
      branch = addChildToBranchNode(branch,bVar4 & 0x3f,(int)lVar20);
      branch->child[lVar20].ptrAndType = 0;
      (branch->occupation).occupation = (branch->occupation).occupation | 1L << (bVar4 & 0x3f);
    }
    else {
      lVar20 = lVar20 + -1;
    }
    insertNode->ptrAndType = (ulong)branch | 6;
    hashPos = hashPos + 1;
    insertNode = branch->child + lVar20;
    goto switchD_0032d395_caseD_7;
  }
  return pVar27;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }